

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int iVar1;
  float *pfVar2;
  unsigned_short *puVar3;
  int iVar4;
  float *__dest;
  unsigned_short *__dest_00;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = (this->IndexLookup).Size;
  lVar7 = (long)iVar1;
  if ((this->IndexXAdvance).Size != iVar1) {
    __assert_fail("IndexXAdvance.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x77a,"void ImFont::GrowIndex(int)");
  }
  if (iVar1 < new_size) {
    iVar4 = (this->IndexXAdvance).Capacity;
    if (iVar4 < new_size) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      if (iVar5 <= new_size) {
        iVar5 = new_size;
      }
      if (iVar4 < iVar5) {
        __dest = (float *)ImGui::MemAlloc((long)iVar5 << 2);
        pfVar2 = (this->IndexXAdvance).Data;
        if (pfVar2 != (float *)0x0) {
          memcpy(__dest,pfVar2,(long)(this->IndexXAdvance).Size << 2);
        }
        ImGui::MemFree((this->IndexXAdvance).Data);
        (this->IndexXAdvance).Data = __dest;
        (this->IndexXAdvance).Capacity = iVar5;
      }
    }
    (this->IndexXAdvance).Size = new_size;
    iVar4 = (this->IndexLookup).Capacity;
    if (iVar4 < new_size) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      if (iVar5 <= new_size) {
        iVar5 = new_size;
      }
      if (iVar4 < iVar5) {
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
        puVar3 = (this->IndexLookup).Data;
        if (puVar3 != (unsigned_short *)0x0) {
          memcpy(__dest_00,puVar3,(long)(this->IndexLookup).Size * 2);
        }
        ImGui::MemFree((this->IndexLookup).Data);
        (this->IndexLookup).Data = __dest_00;
        (this->IndexLookup).Capacity = iVar5;
      }
    }
    (this->IndexLookup).Size = new_size;
    if (iVar1 < new_size) {
      iVar4 = (this->IndexXAdvance).Size;
      if (iVar4 < iVar1) {
        iVar4 = iVar1;
      }
      pfVar2 = (this->IndexXAdvance).Data;
      puVar3 = (this->IndexLookup).Data;
      lVar6 = 0;
      do {
        if (iVar4 - lVar7 == lVar6) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                        ,0x38b,"value_type &ImVector<float>::operator[](int) [T = float]");
        }
        pfVar2[lVar7 + lVar6] = -1.0;
        puVar3[lVar7 + lVar6] = 0xffff;
        lVar6 = lVar6 + 1;
      } while (new_size - iVar1 != (int)lVar6);
    }
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexXAdvance.Size == IndexLookup.Size);
    int old_size = IndexLookup.Size;
    if (new_size <= old_size)
        return;
    IndexXAdvance.resize(new_size);
    IndexLookup.resize(new_size);
    for (int i = old_size; i < new_size; i++)
    {
        IndexXAdvance[i] = -1.0f;
        IndexLookup[i] = (unsigned short)-1;
    }
}